

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Api.cpp
# Opt level: O3

vector<AEntity_*,_std::allocator<AEntity_*>_> * __thiscall
Api::getBoardPlayer(Api *this,int player,bool verbose)

{
  Player *pPVar1;
  vector<AEntity_*,_std::allocator<AEntity_*>_> *pvVar2;
  ostream *poVar3;
  ACard *this_00;
  undefined7 in_register_00000011;
  ulong uVar4;
  string local_50;
  
  pPVar1 = GameManager::get_player(&this->_game);
  pvVar2 = Player::get_board(pPVar1 + player);
  if ((int)CONCAT71(in_register_00000011,verbose) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Board player ",0xd);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,player);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((pvVar2->super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>)._M_impl.
        super__Vector_impl_data._M_finish !=
        (pvVar2->super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>)._M_impl.
        super__Vector_impl_data._M_start) {
      uVar4 = 0;
      do {
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
        this_00 = AEntity::get_reference
                            ((pvVar2->super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar4]);
        ACard::get_name_abi_cxx11_(&local_50,this_00);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
        std::ostream::put((char)poVar3);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < (ulong)((long)(pvVar2->
                                     super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>).
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(pvVar2->
                                     super__Vector_base<AEntity_*,_std::allocator<AEntity_*>_>).
                                     _M_impl.super__Vector_impl_data._M_start >> 3));
    }
  }
  return pvVar2;
}

Assistant:

const std::vector<AEntity *> & Api::getBoardPlayer(int player, bool verbose)
{
    if (verbose){
        const std::vector<AEntity *> &board = this->_game.get_player()[player].get_board();
        std::cout << "Board player " << player << ": " << std::endl;
        for (int i = 0; i < board.size(); i += 1) {
            std::cout << i << ": " << board[i]->get_reference()->get_name() << std::endl;
        }
        return board;
    } else {
        return this->_game.get_player()[player].get_board();
    }
}